

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,KeyData *key,string *arg)

{
  KeyData *this_00;
  DescriptorKeyType DVar1;
  bool bVar2;
  ExtPrivkey local_a8;
  
  this->key_type_ = kDescriptorKeyPublic;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  KeyData::GetPubkey(&this->pubkey_,key);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  this_00 = &this->key_data_;
  KeyData::KeyData(this_00,key);
  if (arg == (string *)0x0) {
    ::std::__cxx11::string::string((string *)&this->argument_,"",(allocator *)&local_a8);
  }
  else {
    ::std::__cxx11::string::string((string *)&this->argument_,(string *)arg);
  }
  bVar2 = KeyData::HasExtPrivkey(this_00);
  if (bVar2) {
    KeyData::GetExtPrivkey(&local_a8,this_00);
    ExtPrivkey::operator=(&this->extprivkey_,&local_a8);
    ExtPrivkey::~ExtPrivkey(&local_a8);
    DVar1 = kDescriptorKeyBip32Priv;
  }
  else {
    bVar2 = KeyData::HasExtPubkey(this_00);
    if (!bVar2) goto LAB_001b52b9;
    KeyData::GetExtPubkey((ExtPubkey *)&local_a8,this_00);
    ExtPubkey::operator=(&this->extpubkey_,(ExtPubkey *)&local_a8);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&local_a8);
    DVar1 = kDescriptorKeyBip32;
  }
  this->key_type_ = DVar1;
LAB_001b52b9:
  SchnorrPubkey::FromPubkey((SchnorrPubkey *)&local_a8,&this->pubkey_,(bool *)0x0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             &local_a8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const KeyData& key, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyPublic),
      pubkey_(key.GetPubkey()),
      key_data_(key),
      argument_((arg) ? *arg : "") {
  if (key_data_.HasExtPrivkey()) {
    extprivkey_ = key_data_.GetExtPrivkey();
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
  } else if (key_data_.HasExtPubkey()) {
    extpubkey_ = key_data_.GetExtPubkey();
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
  }
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}